

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

void us_internal_free_closed_sockets(us_loop_t *loop)

{
  us_socket_t *puVar1;
  us_socket_t *p;
  
  p = (loop->data).closed_head;
  if (p != (us_socket_t *)0x0) {
    while (p != (us_socket_t *)0x0) {
      puVar1 = p->next;
      us_poll_free(&p->p,loop);
      p = puVar1;
    }
    (loop->data).closed_head = (us_socket_t *)0x0;
  }
  return;
}

Assistant:

void us_internal_free_closed_sockets(struct us_loop_t *loop) {
    /* Free all closed sockets (maybe it is better to reverse order?) */
    if (loop->data.closed_head) {
        for (struct us_socket_t *s = loop->data.closed_head; s; ) {
            struct us_socket_t *next = s->next;
            us_poll_free((struct us_poll_t *) s, loop);
            s = next;
        }
        loop->data.closed_head = 0;
    }
}